

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall
t_st_generator::st_class_method(t_st_generator *this,ostream *out,string *cls,string *name)

{
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,cls," class");
  std::__cxx11::string::string((string *)&sStack_58,(string *)name);
  st_method(this,out,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void t_st_generator::st_class_method(std::ostream& out, string cls, string name) {
  st_method(out, cls + " class", name);
}